

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  uint index;
  pointer pTVar1;
  Expression **ppEVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  LocalGet *get;
  size_type sVar5;
  Expression *pEVar6;
  LocalSet *this;
  HeapType heapType;
  RefAs *pRVar7;
  Type type;
  __uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_> _Var8;
  size_t sVar9;
  size_type *psVar10;
  pointer pTVar11;
  pointer pppEVar12;
  pointer pppEVar13;
  undefined1 local_e0 [8];
  LocalStructuralDominance info;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  Type type_1;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_68;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *local_50;
  Module *local_48;
  Builder local_40;
  Builder builder;
  
  if (((wasm->features).features & 0x1100) == 0x100) {
    pTVar11 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar1 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_48 = wasm;
    builder.wasm = (Module *)func;
    do {
      if (pTVar11 == pTVar1) {
        return;
      }
      info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = pTVar11->id;
      bVar3 = wasm::Type::isNonNullable
                        ((Type *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
      pTVar11 = pTVar11 + 1;
    } while (!bVar3);
    LocalStructuralDominance::LocalStructuralDominance
              ((LocalStructuralDominance *)local_e0,(Function *)builder.wasm,local_48,
               NonNullableOnly);
    info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&badIndexes._M_h._M_rehash_policy._M_next_resize;
    badIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
    psVar10 = &badIndexes._M_h._M_bucket_count;
    badIndexes._M_h._M_bucket_count = 0;
    badIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    badIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
    badIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    badIndexes._M_h._M_rehash_policy._4_4_ = 0;
    badIndexes._M_h._M_rehash_policy._M_next_resize = 0;
    for (p_Var4 = info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&info; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
    {
      local_40.wasm._0_4_ = p_Var4[1]._M_color;
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (value_type *)&local_40);
      local_68._M_impl.super__Vector_impl_data._M_start =
           (pointer)Function::getLocalType((Function *)builder.wasm,(_Rb_tree_color)local_40.wasm);
      bVar3 = wasm::Type::isNonNullable((Type *)&local_68);
      if (!bVar3) {
        __assert_fail("func->getLocalType(index).isNonNullable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                      ,0x154,
                      "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)");
      }
      bVar3 = Function::isParam((Function *)builder.wasm,(_Rb_tree_color)local_40.wasm);
      if (bVar3) {
        __assert_fail("!func->isParam(index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                      ,0x155,
                      "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)");
      }
    }
    if (badIndexes._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      local_40.wasm = local_48;
      local_50 = &(builder.wasm)->elementSegments;
      FindAllPointers<wasm::LocalGet>::FindAllPointers
                ((FindAllPointers<wasm::LocalGet> *)&local_68,(Expression **)local_50);
      pppEVar13 = local_68._M_impl.super__Vector_impl_data._M_finish;
      for (pppEVar12 = local_68._M_impl.super__Vector_impl_data._M_start; pppEVar12 != pppEVar13;
          pppEVar12 = pppEVar12 + 1) {
        ppEVar2 = *pppEVar12;
        get = Expression::cast<wasm::LocalGet>(*ppEVar2);
        sVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&get->index);
        if (sVar5 != 0) {
          pEVar6 = fixLocalGet(get,local_48);
          *ppEVar2 = pEVar6;
        }
      }
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                (&local_68);
      FindAllPointers<wasm::LocalSet>::FindAllPointers
                ((FindAllPointers<wasm::LocalSet> *)&local_68,(Expression **)local_50);
      local_50 = (vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  *)local_68._M_impl.super__Vector_impl_data._M_finish;
      for (pppEVar13 = local_68._M_impl.super__Vector_impl_data._M_start;
          (vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           *)pppEVar13 != local_50; pppEVar13 = pppEVar13 + 1) {
        ppEVar2 = *pppEVar13;
        this = Expression::cast<wasm::LocalSet>(*ppEVar2);
        bVar3 = Function::isVar((Function *)builder.wasm,this->index);
        if (((bVar3) && (bVar3 = LocalSet::isTee(this), bVar3)) &&
           ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id != 1)
           ) {
          sVar5 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,&this->index);
          if (sVar5 != 0) {
            badIndexes._M_h._M_single_bucket =
                 (__node_base_ptr)Function::getLocalType((Function *)builder.wasm,this->index);
            heapType = wasm::Type::getHeapType((Type *)&badIndexes._M_h._M_single_bucket);
            wasm::Type::Type(&type_1,heapType,Nullable);
            (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
                 type_1.id;
            pRVar7 = Builder::makeRefAs(&local_40,RefAsNonNull,(Expression *)this);
            *ppEVar2 = (Expression *)pRVar7;
          }
        }
      }
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                (&local_68);
      while (psVar10 = (size_type *)*psVar10, psVar10 != (size_type *)0x0) {
        index = *(uint *)&((__node_base *)(psVar10 + 1))->_M_nxt;
        type = Function::getLocalType((Function *)builder.wasm,index);
        _Var8._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
             (tuple<wasm::Tag_*,_std::default_delete<wasm::Tag>_>)
             getValidLocalType(type,(FeatureSet)(local_48->features).features);
        sVar9 = Function::getNumParams((Function *)builder.wasm);
        ((builder.wasm)->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[index - sVar9]._M_t.
        super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t =
             _Var8._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      }
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_e0);
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (wasm.features.hasGCNNLocals()) {
    // We have nothing to fix up: all locals are allowed.
    return;
  }
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto type : func->vars) {
    if (type.isNonNullable()) {
      hasNonNullable = true;
      break;
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      set->type = Type(type.getHeapType(), Nullable);
      *setp = builder.makeRefAs(RefAsNonNull, set);
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}